

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

obj_property * brand_property(wchar_t brand_idx)

{
  obj_property *poVar1;
  char *pcVar2;
  char *s;
  obj_property *prop;
  wchar_t i;
  wchar_t brand_idx_local;
  
  prop._0_4_ = 1;
  while( true ) {
    if ((int)(uint)z_info->property_max <= (int)prop) {
      return (obj_property *)0x0;
    }
    poVar1 = obj_properties + (int)prop;
    pcVar2 = strstr(poVar1->name,brands[brand_idx].name);
    if (pcVar2 != (char *)0x0) break;
    prop._0_4_ = (int)prop + 1;
  }
  return poVar1;
}

Assistant:

struct obj_property *brand_property(int brand_idx)
{
	int i;

	for (i = 1; i < z_info->property_max; i++) {
		struct obj_property *prop =	&obj_properties[i];
		char *s = strstr(prop->name, brands[brand_idx].name);
		if (s) return prop;
	}
	return NULL;
}